

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_run_container_iandnot
                (bitset_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int iVar2;
  array_container_t *paVar3;
  int32_t rlepos;
  long lVar4;
  
  *dst = src_1;
  for (lVar4 = 0; lVar4 < src_2->n_runs; lVar4 = lVar4 + 1) {
    uVar1 = src_2->runs[lVar4].value;
    bitset_reset_range(src_1->words,(uint)uVar1,(uint)uVar1 + (uint)src_2->runs[lVar4].length + 1);
  }
  iVar2 = bitset_container_compute_cardinality(src_1);
  src_1->cardinality = iVar2;
  if (iVar2 < 0x1001) {
    paVar3 = array_container_from_bitset(src_1);
    *dst = paVar3;
    bitset_container_free(src_1);
  }
  return 0x1000 < iVar2;
}

Assistant:

bool bitset_run_container_iandnot(
    bitset_container_t *src_1, const run_container_t *src_2,
    container_t **dst
){
    *dst = src_1;

    for (int32_t rlepos = 0; rlepos < src_2->n_runs; ++rlepos) {
        rle16_t rle = src_2->runs[rlepos];
        bitset_reset_range(src_1->words, rle.value,
                           rle.value + rle.length + UINT32_C(1));
    }
    src_1->cardinality = bitset_container_compute_cardinality(src_1);

    if (src_1->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else
        return true;
}